

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this,
          Animatable<std::array<float,_2UL>_> *fallback)

{
  Animatable<std::array<float,_2UL>_> *fallback_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<std::array<float,_2UL>_>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<std::array<float,_2UL>_>_>::optional
            (&this->_attrib);
  this->_empty = false;
  Animatable<std::array<float,_2UL>_>::Animatable(&this->_fallback,fallback);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}